

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O3

bool __thiscall cmParseDelphiCoverage::HTMLParser::ParseFile(HTMLParser *this,char *file)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  key_type *__k;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  long *plVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  ulong uVar10;
  size_type *psVar11;
  char cVar12;
  bool bVar13;
  string filename;
  string glob;
  string lineresult;
  string filelineoffset;
  string lastroutine;
  string line;
  Glob gl;
  ifstream in;
  char *local_3a0;
  long local_398;
  char local_390;
  undefined7 uStack_38f;
  long *local_380 [2];
  long local_370 [2];
  string local_360;
  FileLinesType *local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  char *local_318;
  undefined8 local_310;
  char local_308;
  undefined7 uStack_307;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  char *local_2d8;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [48];
  bool local_260;
  undefined1 local_238 [16];
  _func_int *local_228 [2];
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_2d8 = file;
  std::__cxx11::string::string((string *)&local_2b0,file,(allocator *)local_238);
  local_338 = &local_328;
  local_330 = 0;
  local_328 = 0;
  local_2f8 = &local_2e8;
  local_2f0 = 0;
  local_2e8 = 0;
  local_3a0 = &local_390;
  local_398 = 0;
  local_390 = '\0';
  local_318 = &local_308;
  local_310 = 0;
  local_308 = '\0';
  lVar6 = std::__cxx11::string::find((char)&local_2b0,0x28);
  if (lVar6 != -1) {
    do {
      cVar12 = (char)&local_2b0;
      std::__cxx11::string::find(cVar12,0x29);
      std::__cxx11::string::substr((ulong)local_238,(ulong)&local_2b0);
      std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_238);
      if ((_func_int **)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_228[0] + 1));
      }
      lVar6 = std::__cxx11::string::find((char *)&local_3a0,0x588ab6,0);
      if (lVar6 != -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,"Coverage found for file:  ",0x1a);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,local_3a0,local_398);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                     ,0x89,(char *)local_290._0_8_,this->Coverage->Quiet);
        if ((GlobInternals *)local_290._0_8_ != (GlobInternals *)(local_290 + 0x10)) {
          operator_delete((void *)local_290._0_8_,(ulong)(local_290._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        std::ios_base::~ios_base(local_1c8);
        cmsys::Glob::Glob((Glob *)local_290);
        local_290[8] = true;
        local_260 = false;
        local_238._0_8_ = local_228;
        pcVar2 = (this->Coverage->SourceDir)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,pcVar2,pcVar2 + (this->Coverage->SourceDir)._M_string_length)
        ;
        std::__cxx11::string::append(local_238);
        plVar8 = (long *)std::__cxx11::string::_M_append(local_238,(ulong)local_3a0);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_360.field_2._M_allocated_capacity = *psVar11;
          local_360.field_2._8_8_ = plVar8[3];
        }
        else {
          local_360.field_2._M_allocated_capacity = *psVar11;
          local_360._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_360._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((_func_int **)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_228[0] + 1));
        }
        cmsys::Glob::FindFiles((Glob *)local_290,&local_360,(GlobMessages *)0x0);
        pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_290);
        __k = (pvVar9->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        if (__k == (pvVar9->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,"Unable to find file matching",0x1c);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_238,local_360._M_dataplus._M_p,
                              local_360._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar1 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                       ,0xa0,(char *)local_380[0],this->Coverage->Quiet);
          if (local_380[0] != local_370) {
            operator_delete(local_380[0],local_370[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
          std::ios_base::~ios_base(local_1c8);
          bVar13 = false;
        }
        else {
          local_340 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->Coverage->TotalCoverage,__k);
          pbVar3 = (pvVar9->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pcVar2 = (pbVar3->_M_dataplus)._M_p;
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,pcVar2,pcVar2 + pbVar3->_M_string_length);
          initializeDelphiFile(this,&local_2d0,local_340);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          std::ifstream::ifstream(local_238,local_2d8,_S_in);
          bVar13 = (abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0;
          if (bVar13) {
            while (bVar4 = cmsys::SystemTools::GetLineFromStream
                                     ((istream *)local_238,&local_2b0,(bool *)0x0,-1), bVar4) {
              lVar6 = std::__cxx11::string::find((char *)&local_2b0,0x588af3,0);
              if (lVar6 != -1) {
                uVar10 = std::__cxx11::string::find((char *)&local_2b0,0x588afa,0);
                std::__cxx11::string::find((char *)&local_2b0,0x58dd77,uVar10);
                std::__cxx11::string::substr((ulong)local_380,(ulong)&local_2b0);
                std::__cxx11::string::operator=((string *)&local_338,(string *)local_380);
                if (local_380[0] != local_370) {
                  operator_delete(local_380[0],local_370[0] + 1);
                }
                iVar5 = std::__cxx11::string::compare((char *)&local_338);
                if (iVar5 == 0) {
                  std::__cxx11::string::find((char)&local_2b0,0x3c);
                  std::__cxx11::string::substr((ulong)local_380,(ulong)&local_2b0);
                  std::__cxx11::string::operator=((string *)&local_318,(string *)local_380);
                  if (local_380[0] != local_370) {
                    operator_delete(local_380[0],local_370[0] + 1);
                  }
                  iVar5 = atoi(local_318);
                  (local_340->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar5 + -1] = 1;
                }
              }
            }
          }
          std::ifstream::~ifstream(local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        cmsys::Glob::~Glob((Glob *)local_290);
        goto LAB_0028dfaf;
      }
      lVar6 = std::__cxx11::string::find(cVar12,0x28);
    } while (lVar6 != -1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_238);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"File not found  ",0x10);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
               ,0x7f,(char *)local_290._0_8_,this->Coverage->Quiet);
  if ((GlobInternals *)local_290._0_8_ != (GlobInternals *)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_,(ulong)(local_290._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  bVar13 = false;
LAB_0028dfaf:
  if (local_318 != &local_308) {
    operator_delete(local_318,CONCAT71(uStack_307,local_308) + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return bVar13;
}

Assistant:

bool ParseFile(const char* file)
    {
    std::string line=file;
    std::string lineresult;
    std::string lastroutine;
    std::string filename;
    std::string filelineoffset;
    size_t afterLineNum = 0;
    size_t lastoffset = 0;
    size_t endcovpos = 0;
    size_t endnamepos = 0;
    size_t pos = 0;

    /*
    *  This first 'while' section goes through the found HTML
    *  file name and attempts to capture the source file name
    *   which is set as part of the HTML file name: the name of
    *   the file is found in parenthesis '()'
    *
    *   See test HTML file name: UTCovTest(UTCovTest.pas).html.
    *
    *   Find the text inside each pair of parenthesis and check
    *   to see if it ends in '.pas'.  If it can't be found,
    *   exit the function.
    */
    while(true)
      {
      lastoffset = line.find('(',pos);
      if(lastoffset==line.npos)
        {
        cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
           endnamepos << "File not found  " << lastoffset  << std::endl,
           this->Coverage.Quiet);
        return false;
        }
      endnamepos = line.find(')',lastoffset);
      filename = line.substr(lastoffset+1,
         (endnamepos-1)-lastoffset);
      if(filename.find(".pas") != filename.npos)
        {
        cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
           "Coverage found for file:  " << filename  << std::endl,
           this->Coverage.Quiet);
        break;
        }
      pos = lastoffset+1;
      }
    /*
    *  Glob through the source directory for the
    *  file found above
    */
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOff();
    std::string glob = Coverage.SourceDir + "*/" + filename;
    gl.FindFiles(glob);
    std::vector<std::string> const& files = gl.GetFiles();
    if(files.empty())
      {
      /*
      *  If that doesn't find any matching files
      *  return a failure.
      */
      cmCTestOptionalLog(this->CTest,HANDLER_VERBOSE_OUTPUT,
         "Unable to find file matching" << glob << std::endl,
         this->Coverage.Quiet);
      return false;
      }
    FileLinesType&  coverageVector =
       this->Coverage.TotalCoverage[files[0]];

    /*
    *  Initialize the file to have all code between 'begin' and
    *  'end' tags marked as executable
    */

    this->initializeDelphiFile(files[0],coverageVector);

    cmsys::ifstream in(file);
    if(!in)
      {
      return false;
      }

    /*
    *  Now read the HTML file, looking for the lines that have an
    *  "inline" in it. Then parse out the "class" value of that
    *  line to determine if the line is executed or not.
    *
    *  Sample HTML line:
    *
    *  <tr class="covered"><td>47</td><td><pre style="display:inline;">
    *    &nbsp;CheckEquals(1,2-1);</pre></td></tr>
    *
    */

    while(  cmSystemTools::GetLineFromStream(in, line))
      {
      if(line.find("inline") == line.npos)
        {
        continue;
        }

      lastoffset = line.find("class=");
      endcovpos = line.find(">",lastoffset);
      lineresult = line.substr(lastoffset+7,(endcovpos-8)-lastoffset);

      if(lineresult == "covered")
        {
        afterLineNum = line.find('<',endcovpos+5);
        filelineoffset= line.substr(endcovpos+5,
        afterLineNum-(endcovpos+5));
        coverageVector[atoi(filelineoffset.c_str())-1] = 1;
        }
      }
      return true;
    }